

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O2

ClearOp * deqp::egl::computeRandomClear
                    (ClearOp *__return_storage_ptr__,Random *rnd,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  
  iVar1 = de::Random::getInt(rnd,1,width);
  iVar2 = de::Random::getInt(rnd,1,height);
  iVar3 = de::Random::getInt(rnd,0,width - iVar1);
  iVar4 = de::Random::getInt(rnd,0,height - iVar2);
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  __return_storage_ptr__->x = iVar3;
  __return_storage_ptr__->y = iVar4;
  __return_storage_ptr__->width = iVar1;
  __return_storage_ptr__->height = iVar2;
  (__return_storage_ptr__->color).m_value = dVar5;
  return __return_storage_ptr__;
}

Assistant:

static ClearOp computeRandomClear (de::Random& rnd, int width, int height)
{
	int			w		= rnd.getInt(1, width);
	int			h		= rnd.getInt(1, height);
	int			x		= rnd.getInt(0, width-w);
	int			y		= rnd.getInt(0, height-h);
	tcu::RGBA	col		(rnd.getUint32());

	return ClearOp(x, y, w, h, col);
}